

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateReferencedByShaderCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_int *generateBlockContent)

{
  deInt32 *pdVar1;
  GLSLVersion GVar2;
  Context *pCVar3;
  TestNode *pTVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  ShaderSet *pSVar7;
  long *plVar8;
  long *plVar9;
  uint uVar10;
  long lVar11;
  SharedPtr stage;
  SharedPtr program;
  SharedPtr program_2;
  SharedPtr local_108;
  Node local_f8;
  Node local_d8;
  SharedPtr local_b8;
  deUint32 local_a4;
  Context *local_a0;
  TestNode *local_98;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_int *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  anon_struct_24_4_e9b1bef3 *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  long local_40;
  char *local_38;
  
  lVar11 = 0xc;
  local_d8.m_enclosingNode.m_state._4_4_ = glslVersion;
  local_a0 = context;
  local_98 = &targetGroup->super_TestNode;
  local_90 = generateBlockContent;
  do {
    pTVar4 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,context->m_testCtx,
               *(char **)((long)&generateUniformMatrixStrideCaseBlockContentCases::qualifiers[2].
                                 name + lVar11 + 4),glcts::fixed_sample_locations_values + 1);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
    pTVar4[1]._vptr_TestNode = (_func_int **)context;
    GVar2 = *(GLSLVersion *)
             (&generateUniformMatrixStrideCaseBlockContentCases::qualifiers[2].field_0xc + lVar11);
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->m_type = TYPE_PROGRAM;
    (pNVar5->m_enclosingNode).m_ptr = (Node *)0x0;
    (pNVar5->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021a6eb0;
    *(bool *)&pNVar5[1]._vptr_Node = GVar2 != GLSL_VERSION_140;
    local_f8.m_enclosingNode.m_state = (SharedPtrStateBase *)0x0;
    local_f8.m_enclosingNode.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_f8.m_enclosingNode.m_state = pSVar6;
    pSVar7 = (ShaderSet *)operator_new(0x28);
    (pSVar7->super_Node)._vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    (pSVar7->super_Node).m_type = TYPE_SHADER;
    (pSVar7->super_Node).m_enclosingNode.m_ptr = pNVar5;
    (pSVar7->super_Node).m_enclosingNode.m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pSVar7->super_Node).m_enclosingNode.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    (pSVar7->super_Node)._vptr_Node = (_func_int **)&PTR__Node_021a6f58;
    pSVar7->m_version = GVar2;
    *(GLSLVersion *)pSVar7->m_stagePresent = local_d8.m_enclosingNode.m_state._4_4_;
    local_108.m_state = (SharedPtrStateBase *)0x0;
    local_108.m_ptr = (Node *)pSVar7;
    local_108.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_108.m_state)->strongRefCount = 0;
    (local_108.m_state)->weakRefCount = 0;
    (local_108.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_108.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar7;
    (local_108.m_state)->strongRefCount = 1;
    (local_108.m_state)->weakRefCount = 1;
    tcu::TestNode::addChild(local_98,pTVar4);
    context = local_a0;
    (*local_90)(local_a0,&local_108,(TestCaseGroup *)pTVar4,
                *(int *)((long)&generateReferencedByShaderCaseBlocks::singleStageCases[0].name +
                        lVar11));
    if (local_108.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_108.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_108.m_ptr = (Node *)0x0;
        (*(local_108.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_108.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_108.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_108.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_108.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_f8.m_enclosingNode.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_f8.m_enclosingNode.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_f8.m_enclosingNode.m_ptr = (Node *)0x0;
        (*(local_f8.m_enclosingNode.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_f8.m_enclosingNode.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_f8.m_enclosingNode.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_f8.m_enclosingNode.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_f8.m_enclosingNode.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x6c);
  lVar11 = 0;
  do {
    pTVar4 = (TestNode *)operator_new(0x78);
    local_38 = generateReferencedByShaderCaseBlocks::pipelines[lVar11].name;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,context->m_testCtx,local_38,
               glcts::fixed_sample_locations_values + 1);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
    pTVar4[1]._vptr_TestNode = (_func_int **)context;
    local_40 = lVar11;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->m_type = TYPE_PROGRAM;
    (pNVar5->m_enclosingNode).m_ptr = (Node *)0x0;
    (pNVar5->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021a6eb0;
    *(undefined1 *)&pNVar5[1]._vptr_Node = 0;
    local_f8.m_enclosingNode.m_state = (SharedPtrStateBase *)0x0;
    local_f8.m_enclosingNode.m_ptr = pNVar5;
    local_f8.m_enclosingNode.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_f8.m_enclosingNode.m_state)->strongRefCount = 0;
    (local_f8.m_enclosingNode.m_state)->weakRefCount = 0;
    (local_f8.m_enclosingNode.m_state)->_vptr_SharedPtrStateBase =
         (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_f8.m_enclosingNode.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_f8.m_enclosingNode.m_state)->strongRefCount = 1;
    (local_f8.m_enclosingNode.m_state)->weakRefCount = 1;
    pSVar7 = (ShaderSet *)operator_new(0x30);
    local_68 = generateReferencedByShaderCaseBlocks::pipelines + lVar11;
    local_a4 = generateReferencedByShaderCaseBlocks::pipelines[lVar11].flags;
    ResourceDefinition::ShaderSet::ShaderSet
              (pSVar7,&local_f8.m_enclosingNode,local_d8.m_enclosingNode.m_state._4_4_,local_a4,
               local_a4);
    tcu::TestNode::addChild(local_98,pTVar4);
    local_108.m_state = (SharedPtrStateBase *)0x0;
    local_108.m_ptr = (Node *)pSVar7;
    local_108.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_108.m_state)->strongRefCount = 0;
    (local_108.m_state)->weakRefCount = 0;
    (local_108.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_108.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar7;
    (local_108.m_state)->strongRefCount = 1;
    (local_108.m_state)->weakRefCount = 1;
    (*local_90)(context,&local_108,(TestCaseGroup *)pTVar4,local_68->expandLevel);
    if (local_108.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_108.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_108.m_ptr = (Node *)0x0;
        (*(local_108.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_108.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_108.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_108.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_108.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_f8.m_enclosingNode.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_f8.m_enclosingNode.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_f8.m_enclosingNode.m_ptr = (Node *)0x0;
        (*(local_f8.m_enclosingNode.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_f8.m_enclosingNode.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_f8.m_enclosingNode.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_f8.m_enclosingNode.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_f8.m_enclosingNode.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    uVar10 = 0;
    do {
      if ((local_a4 >> (uVar10 & 0x1f) & 1) != 0) {
        pNVar5 = (Node *)operator_new(0x28);
        pNVar5->m_type = TYPE_PROGRAM;
        (pNVar5->m_enclosingNode).m_ptr = (Node *)0x0;
        (pNVar5->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021a6eb0;
        *(undefined1 *)&pNVar5[1]._vptr_Node = 0;
        local_b8.m_state = (SharedPtrStateBase *)0x0;
        local_b8.m_ptr = pNVar5;
        local_b8.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_b8.m_state)->strongRefCount = 0;
        (local_b8.m_state)->weakRefCount = 0;
        (local_b8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
        local_b8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        (local_b8.m_state)->strongRefCount = 1;
        (local_b8.m_state)->weakRefCount = 1;
        pSVar7 = (ShaderSet *)operator_new(0x30);
        ResourceDefinition::ShaderSet::ShaderSet
                  (pSVar7,&local_b8,local_d8.m_enclosingNode.m_state._4_4_,local_a4,
                   1 << ((byte)uVar10 & 0x1f));
        local_60 = &local_50;
        local_58 = 0;
        local_50 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar8[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar8;
        }
        local_80 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
        pNVar5 = (Node *)(plVar8 + 2);
        if ((Node *)*plVar8 == pNVar5) {
          local_f8._vptr_Node = pNVar5->_vptr_Node;
          local_f8._8_8_ = plVar8[3];
          local_108.m_ptr = &local_f8;
        }
        else {
          local_f8._vptr_Node = pNVar5->_vptr_Node;
          local_108.m_ptr = (Node *)*plVar8;
        }
        local_108.m_state = (SharedPtrStateBase *)plVar8[1];
        *plVar8 = (long)pNVar5;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
        pNVar5 = (Node *)(plVar8 + 2);
        if ((Node *)*plVar8 == pNVar5) {
          local_d8._vptr_Node = pNVar5->_vptr_Node;
          local_d8._8_8_ = plVar8[3];
          local_f8.m_enclosingNode.m_ptr = &local_d8;
        }
        else {
          local_d8._vptr_Node = pNVar5->_vptr_Node;
          local_f8.m_enclosingNode.m_ptr = (Node *)*plVar8;
        }
        local_f8.m_enclosingNode.m_state = (SharedPtrStateBase *)plVar8[1];
        *plVar8 = (long)pNVar5;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_108.m_ptr != &local_f8) {
          operator_delete(local_108.m_ptr,(long)local_f8._vptr_Node + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
        }
        pTVar4 = (TestNode *)operator_new(0x78);
        pCVar3 = local_a0;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar4,local_a0->m_testCtx,
                   (char *)local_f8.m_enclosingNode.m_ptr,glcts::fixed_sample_locations_values + 1);
        pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
        pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
        local_108.m_state = (SharedPtrStateBase *)0x0;
        local_108.m_ptr = (Node *)pSVar7;
        local_108.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_108.m_state)->strongRefCount = 0;
        (local_108.m_state)->weakRefCount = 0;
        (local_108.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
        local_108.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar7;
        (local_108.m_state)->strongRefCount = 1;
        (local_108.m_state)->weakRefCount = 1;
        (*local_90)(pCVar3,&local_108,(TestCaseGroup *)pTVar4,local_68->subExpandLevel);
        tcu::TestNode::addChild(local_98,pTVar4);
        if (local_108.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_108.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_108.m_ptr = (Node *)0x0;
            (*(local_108.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_108.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_108.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_108.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_108.m_state = (SharedPtrStateBase *)0x0;
          }
        }
        if (local_f8.m_enclosingNode.m_ptr != &local_d8) {
          operator_delete(local_f8.m_enclosingNode.m_ptr,(long)local_d8._vptr_Node + 1);
        }
        if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_b8.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_b8.m_ptr = (Node *)0x0;
            (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_b8.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_b8.m_state = (SharedPtrStateBase *)0x0;
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 6);
    lVar11 = local_40 + 1;
    context = local_a0;
  } while (lVar11 != 4);
  return;
}

Assistant:

static void generateReferencedByShaderCaseBlocks (Context& context, tcu::TestCaseGroup* const targetGroup, glu::GLSLVersion glslVersion, void (*generateBlockContent)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, int expandLevel))
{
	static const struct
	{
		const char*		name;
		glu::ShaderType	stage;
		int				expandLevel;
	} singleStageCases[] =
	{
		{ "compute",				glu::SHADERTYPE_COMPUTE,					3	},
		{ "separable_vertex",		glu::SHADERTYPE_VERTEX,						2	},
		{ "separable_fragment",		glu::SHADERTYPE_FRAGMENT,					2	},
		{ "separable_tess_ctrl",	glu::SHADERTYPE_TESSELLATION_CONTROL,		2	},
		{ "separable_tess_eval",	glu::SHADERTYPE_TESSELLATION_EVALUATION,	2	},
		{ "separable_geometry",		glu::SHADERTYPE_GEOMETRY,					2	},
	};
	static const struct
	{
		const char*	name;
		deUint32	flags;
		int			expandLevel;
		int			subExpandLevel;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT),
			3,
			2,
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			2,
			2,
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY),
			2,
			2,
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
			2,
			1,
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(singleStageCases); ++ndx)
	{
		TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, singleStageCases[ndx].name, "");
		const bool									programSeparable	= (singleStageCases[ndx].stage != glu::SHADERTYPE_COMPUTE);
		const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program(programSeparable));
		const ResourceDefinition::Node::SharedPtr	stage				(new ResourceDefinition::Shader(program, singleStageCases[ndx].stage, glslVersion));

		targetGroup->addChild(blockGroup);

		generateBlockContent(context, stage, blockGroup, singleStageCases[ndx].expandLevel);
	}

	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		// whole pipeline
		{
			TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, pipelines[pipelineNdx].name, "");
			const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program());
			ResourceDefinition::ShaderSet*				shaderSet			= new ResourceDefinition::ShaderSet(program,
																												glslVersion,
																												pipelines[pipelineNdx].flags,
																												pipelines[pipelineNdx].flags);
			targetGroup->addChild(blockGroup);

			{
				const ResourceDefinition::Node::SharedPtr shaders(shaderSet);
				generateBlockContent(context, shaders, blockGroup, pipelines[pipelineNdx].expandLevel);
			}
		}

		// only one stage
		for (int selectedStageBit = 0; selectedStageBit < glu::SHADERTYPE_LAST; ++selectedStageBit)
		{
			if (pipelines[pipelineNdx].flags & (1 << selectedStageBit))
			{
				const ResourceDefinition::Node::SharedPtr	program		(new ResourceDefinition::Program());
				ResourceDefinition::ShaderSet*				shaderSet	= new ResourceDefinition::ShaderSet(program,
																											glslVersion,
																											pipelines[pipelineNdx].flags,
																											(1u << selectedStageBit));
				const char*									stageName	= (selectedStageBit == glu::SHADERTYPE_VERTEX)					? ("vertex")
																		: (selectedStageBit == glu::SHADERTYPE_FRAGMENT)				? ("fragment")
																		: (selectedStageBit == glu::SHADERTYPE_GEOMETRY)				? ("geo")
																		: (selectedStageBit == glu::SHADERTYPE_TESSELLATION_CONTROL)	? ("tess_ctrl")
																		: (selectedStageBit == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? ("tess_eval")
																		: (DE_NULL);
				const std::string							setName		= std::string() + pipelines[pipelineNdx].name + "_only_" + stageName;
				TestCaseGroup* const						blockGroup	= new TestCaseGroup(context, setName.c_str(), "");
				const ResourceDefinition::Node::SharedPtr	shaders		(shaderSet);

				generateBlockContent(context, shaders, blockGroup, pipelines[pipelineNdx].subExpandLevel);
				targetGroup->addChild(blockGroup);
			}
		}
	}
}